

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

ChebyshevExpansion *
ChebTools::ChebyshevExpansion::factoryfFFT
          (ChebyshevExpansion *__return_storage_ptr__,size_t N,VectorXd *f,double xmin,double xmax)

{
  pointer pcVar1;
  ulong uVar2;
  _Base_ptr p_Var3;
  undefined1 auVar4 [16];
  ulong uVar5;
  undefined1 auVar6 [16];
  double dVar7;
  Index size;
  _Alloc_hider _Var8;
  invalid_argument *this;
  long *plVar9;
  undefined8 *puVar10;
  char *pcVar11;
  ulong uVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  double *pdVar17;
  long lVar18;
  undefined1 (*pauVar19) [16];
  VectorXd valsUnitDisc;
  VectorXcd FourierCoeffs;
  ArrayXd ChebCoeffs;
  FFT<double,_Eigen::default_fft_impl<double>_> fft;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  _Alloc_hider local_1a8;
  _Base_ptr p_Stack_1a0;
  string local_188;
  double local_168;
  double local_160;
  undefined1 local_158 [8];
  undefined1 local_150 [24];
  _Base_ptr local_138;
  size_t local_130;
  _Rb_tree<int,_std::pair<const_int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
  local_128;
  pointer pcStack_f8;
  pointer local_f0;
  pointer pcStack_e8;
  pointer local_e0;
  pointer pcStack_d8;
  pointer local_d0;
  FFT<double,_Eigen::default_fft_impl<double>_> local_c8;
  
  lVar15 = (f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_168 = xmin;
  local_160 = xmax;
  if (lVar15 != N + 1) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string
              ((string *)&local_1a8,
               (f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
    ;
    std::operator+(&local_1c8,"Size of f [",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    local_158 = (undefined1  [8])*plVar9;
    pdVar13 = (double *)(plVar9 + 2);
    if (local_158 == (undefined1  [8])pdVar13) {
      local_150._8_8_ = *pdVar13;
      local_150._16_8_ = plVar9[3];
      local_158 = (undefined1  [8])(local_150 + 8);
    }
    else {
      local_150._8_8_ = *pdVar13;
    }
    local_150._0_8_ = plVar9[1];
    *plVar9 = (long)pdVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::__cxx11::to_string(&local_188,N);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   &local_188);
    std::invalid_argument::invalid_argument(this,(string *)&local_c8);
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_1c8._M_dataplus._M_p = (pointer)0x0;
  local_1c8._M_string_length = 0;
  if (lVar15 < 1) {
    pcVar11 = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
    ;
LAB_001349aa:
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x130,pcVar11);
  }
  uVar2 = lVar15 * 2 - 2;
  _Var8._M_p = local_1c8._M_dataplus._M_p;
  if (uVar2 != 0) {
    free((void *)0x0);
    if (lVar15 == 1) {
      local_1c8._M_dataplus._M_p = (pointer)0x0;
      _Var8._M_p = local_1c8._M_dataplus._M_p;
    }
    else {
      if (0x1fffffffffffffff < uVar2) {
LAB_00134a11:
        puVar10 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar10 = std::random_device::_M_fini;
        __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      _Var8._M_p = (pointer)malloc(uVar2 * 8);
      if (((ulong)_Var8._M_p & 0xf) != 0) goto LAB_00134a3f;
      if (_Var8._M_p == (pointer)0x0) goto LAB_00134a11;
    }
  }
  local_1c8._M_dataplus._M_p = _Var8._M_p;
  uVar5 = (f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_1c8._M_string_length = uVar2;
  if ((long)uVar5 < 0 && local_1c8._M_dataplus._M_p != (pointer)0x0) {
    pcVar11 = 
    "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
    ;
LAB_001349c9:
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                  ,0xb2,pcVar11);
  }
  if ((-1 < (long)uVar5) && ((long)uVar5 <= (long)uVar2)) {
    uVar12 = uVar5;
    if ((((ulong)local_1c8._M_dataplus._M_p & 7) == 0) &&
       (uVar12 = (ulong)((uint)((ulong)local_1c8._M_dataplus._M_p >> 3) & 1),
       (long)uVar5 <= (long)uVar12)) {
      uVar12 = uVar5;
    }
    pdVar13 = (f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    lVar15 = uVar5 - uVar12;
    if (0 < (long)uVar12) {
      uVar16 = 0;
      do {
        *(double *)(local_1c8._M_dataplus._M_p + uVar16 * 8) = pdVar13[uVar16];
        uVar16 = uVar16 + 1;
      } while (uVar12 != uVar16);
    }
    uVar16 = (lVar15 - (lVar15 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
    if (1 < lVar15) {
      do {
        dVar7 = (pdVar13 + uVar12)[1];
        *(double *)(local_1c8._M_dataplus._M_p + uVar12 * 8) = pdVar13[uVar12];
        *(double *)((long)(local_1c8._M_dataplus._M_p + uVar12 * 8) + 8) = dVar7;
        uVar12 = uVar12 + 2;
      } while ((long)uVar12 < (long)uVar16);
    }
    if ((long)uVar16 < (long)uVar5) {
      do {
        *(double *)(local_1c8._M_dataplus._M_p + uVar16 * 8) = pdVar13[uVar16];
        uVar16 = uVar16 + 1;
      } while (uVar5 != uVar16);
    }
    lVar15 = (f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (lVar15 < 2) {
      pcVar11 = 
      "Eigen::Block<const Eigen::Reverse<const Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Reverse<const Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_001349e8;
    }
    uVar5 = lVar15 - 2;
    if (-1 < (long)(uVar2 - uVar5 | uVar5)) {
      pcVar1 = local_1c8._M_dataplus._M_p + (uVar2 - uVar5) * 8;
      uVar12 = uVar5;
      if ((((ulong)pcVar1 & 7) == 0) &&
         (uVar12 = (ulong)((uint)((ulong)pcVar1 >> 3) & 1), (long)uVar5 <= (long)uVar12)) {
        uVar12 = uVar5;
      }
      pdVar13 = (f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      lVar18 = uVar5 - uVar12;
      if (0 < (long)uVar12) {
        pdVar17 = pdVar13 + lVar15 + -2;
        uVar16 = 0;
        do {
          *(double *)(pcVar1 + uVar16 * 8) = *pdVar17;
          uVar16 = uVar16 + 1;
          pdVar17 = pdVar17 + -1;
        } while (uVar12 != uVar16);
      }
      lVar14 = (lVar18 - (lVar18 >> 0x3f) & 0xfffffffffffffffeU) + uVar12;
      if (1 < lVar18) {
        pauVar19 = (undefined1 (*) [16])(pdVar13 + ((lVar15 + -3) - uVar12));
        uVar16 = uVar12;
        do {
          auVar4 = *pauVar19;
          auVar6._8_4_ = auVar4._0_4_;
          auVar6._0_8_ = auVar4._8_8_;
          auVar6._12_4_ = auVar4._4_4_;
          *(undefined1 (*) [16])(pcVar1 + uVar16 * 8) = auVar6;
          uVar16 = uVar16 + 2;
          pauVar19 = pauVar19 + -1;
        } while ((long)uVar16 < lVar14);
      }
      if (lVar14 < (long)uVar5) {
        pdVar13 = pdVar13 + (lVar18 / 2) * -2 + ((lVar15 + -2) - uVar12);
        lVar15 = (lVar14 - lVar15) + 2;
        do {
          *(double *)(local_1c8._M_dataplus._M_p + lVar15 * 8 + uVar2 * 8) = *pdVar13;
          pdVar13 = pdVar13 + -1;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0);
      }
      memset((impl_type *)local_158,0,0x90);
      local_130 = 0;
      local_128._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_128._M_impl.super__Rb_tree_header._M_header;
      local_128._M_impl.super__Rb_tree_header._M_header._0_8_ =
           local_128._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_128._M_impl.super__Rb_tree_header._M_node_count = 0;
      pcStack_f8 = (pointer)0x0;
      local_f0 = (pointer)0x0;
      pcStack_e8 = (pointer)0x0;
      local_e0 = (pointer)0x0;
      pcStack_d8 = (pointer)0x0;
      local_d0 = (pointer)0x0;
      local_150._16_8_ = (_Base_ptr)local_150;
      local_138 = (_Base_ptr)local_150;
      local_128._M_impl.super__Rb_tree_header._M_header._M_right =
           local_128._M_impl.super__Rb_tree_header._M_header._M_left;
      Eigen::FFT<double,_Eigen::default_fft_impl<double>_>::FFT
                (&local_c8,(impl_type *)local_158,Default);
      if (local_e0 != (pointer)0x0) {
        operator_delete(local_e0,(long)local_d0 - (long)local_e0);
      }
      if (pcStack_f8 != (pointer)0x0) {
        operator_delete(pcStack_f8,(long)pcStack_e8 - (long)pcStack_f8);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
      ::~_Rb_tree(&local_128);
      std::
      _Rb_tree<int,_std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>,_std::_Select1st<std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>,_std::_Select1st<std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>_>_>
                   *)local_158);
      lVar15 = (f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      local_1a8._M_p = (pointer)0x0;
      p_Stack_1a0 = (_Base_ptr)0x0;
      if (lVar15 < 1) {
        pcVar11 = 
        "void Eigen::PlainObjectBase<Eigen::Matrix<std::complex<double>, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<std::complex<double>, -1, 1>]"
        ;
        goto LAB_001349aa;
      }
      p_Var3 = (_Base_ptr)(lVar15 * 2 - 2);
      _Var8._M_p = local_1a8._M_p;
      if (p_Var3 != (_Base_ptr)0x0) {
        free((void *)0x0);
        if (lVar15 == 1) {
          local_1a8._M_p = (pointer)0x0;
          _Var8._M_p = local_1a8._M_p;
        }
        else {
          if ((ulong)p_Var3 >> 0x3c != 0) {
LAB_00134a5e:
            puVar10 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar10 = std::random_device::_M_fini;
            __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          _Var8._M_p = (pointer)malloc((long)p_Var3 * 0x10);
          if (((ulong)_Var8._M_p & 0xf) != 0) {
LAB_00134a3f:
            __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/util/Memory.h"
                          ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
          }
          if ((double *)_Var8._M_p == (double *)0x0) goto LAB_00134a5e;
        }
      }
      local_1a8._M_p = _Var8._M_p;
      p_Stack_1a0 = p_Var3;
      Eigen::FFT<double,Eigen::default_fft_impl<double>>::
      fwd<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<std::complex<double>,_1,1,0,_1,1>>
                ((FFT<double,Eigen::default_fft_impl<double>> *)&local_c8,
                 (MatrixBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *)&local_1a8,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1c8,-1);
      local_150._0_8_ =
           (f->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      if ((long)local_150._0_8_ < 0 && (double *)local_1a8._M_p != (double *)0x0) {
        pcVar11 = 
        "Eigen::MapBase<Eigen::Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>, Eigen::Matrix<std::complex<double>, -1, 1>>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>, Eigen::Matrix<std::complex<double>, -1, 1>>, -1, 1>, Level = 0]"
        ;
        goto LAB_001349c9;
      }
      if ((-1 < (long)local_150._0_8_) && ((long)local_150._0_8_ <= (long)p_Stack_1a0)) {
        local_128._M_impl.super__Rb_tree_header._M_header._0_8_ =
             (long)p_Stack_1a0 * 2 & 0x1ffffffffffffffe;
        local_128._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)(double)(long)((long)&((_Base_ptr)(local_150._0_8_ + -0x20))->_M_right + 7);
        local_158 = (undefined1  [8])local_1a8._M_p;
        local_130 = 0;
        local_150._16_8_ = (_Base_ptr)&local_1a8;
        local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_150._0_8_;
        Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>,Eigen::Matrix<std::complex<double>,_1,1,0,_1,1>>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                  ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&local_188,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>_>,_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                    *)local_158);
        if ((long)local_188._M_string_length < 1) {
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x19a,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Array<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Array<double, -1, 1>, Level = 1]"
                       );
        }
        *(double *)local_188._M_dataplus._M_p = *(double *)local_188._M_dataplus._M_p * 0.5;
        *(double *)(local_188._M_dataplus._M_p + local_188._M_string_length * 8 + -8) =
             *(double *)(local_188._M_dataplus._M_p + local_188._M_string_length * 8 + -8) * 0.5;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_158,
                   (DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)&local_188);
        ChebyshevExpansion(__return_storage_ptr__,(vectype *)local_158,local_168,local_160);
        free((void *)local_158);
        free(local_188._M_dataplus._M_p);
        free(local_1a8._M_p);
        if (local_c8.m_impl.super_kissfft_impl<double>.m_tmpBuf2.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.m_impl.super_kissfft_impl<double>.m_tmpBuf2.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_c8.m_impl.super_kissfft_impl<double>.m_tmpBuf2.
                                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.m_impl.super_kissfft_impl<double>.m_tmpBuf2.
                                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_c8.m_impl.super_kissfft_impl<double>.m_tmpBuf1.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.m_impl.super_kissfft_impl<double>.m_tmpBuf1.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_c8.m_impl.super_kissfft_impl<double>.m_tmpBuf1.
                                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.m_impl.super_kissfft_impl<double>.m_tmpBuf1.
                                super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
        ::~_Rb_tree(&local_c8.m_impl.super_kissfft_impl<double>.m_realTwiddles._M_t);
        std::
        _Rb_tree<int,_std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>,_std::_Select1st<std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>,_std::_Select1st<std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Eigen::internal::kiss_cpx_fft<double>_>_>_>
                     *)&local_c8);
        free(local_1c8._M_dataplus._M_p);
        return __return_storage_ptr__;
      }
      pcVar11 = 
      "Eigen::Block<Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>, Eigen::Matrix<std::complex<double>, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::CwiseUnaryView<Eigen::internal::scalar_real_ref_op<std::complex<double>>, Eigen::Matrix<std::complex<double>, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_001349e8;
    }
  }
  pcVar11 = 
  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_001349e8:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                ,0x93,pcVar11);
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::factoryfFFT(const std::size_t N, const Eigen::VectorXd& f, const double xmin, const double xmax) {
        if (f.size() != N+1){
            throw std::invalid_argument("Size of f [" + std::to_string(f.size()) + "] does not equal N+1 with N of "+std::to_string(N));
        }
        Eigen::VectorXd valsUnitDisc(2 * f.size() - 2);
        // Starting at x = 1, going to -1, then the same nodes, not including x=-1 and x=1, in the opposite order
        valsUnitDisc.head(f.size()) = f;
        valsUnitDisc.tail(f.size() - 2) = f.reverse().segment(1, f.size() - 2);
        
        Eigen::FFT<double> fft;
        Eigen::VectorXcd FourierCoeffs(2 * f.size() - 2);
        fft.fwd(FourierCoeffs, valsUnitDisc);
        auto n = f.size() - 1;
        Eigen::ArrayXd ChebCoeffs = FourierCoeffs.real().head(n+1)/n;
        ChebCoeffs[0] /= 2;
        ChebCoeffs[ChebCoeffs.size()-1] /= 2;

        return ChebyshevExpansion(ChebCoeffs, xmin, xmax);
    }